

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter.c
# Opt level: O0

int aom_stop_encode(aom_writer *w)

{
  uchar *__src;
  uint *in_RDI;
  uchar *data;
  uint32_t bytes;
  int nb_bits;
  uint32_t *in_stack_00000020;
  od_ec_enc *in_stack_00000028;
  uint local_18;
  int local_4;
  
  __src = od_ec_enc_done(in_stack_00000028,in_stack_00000020);
  if (__src == (uchar *)0x0) {
    od_ec_enc_clear((od_ec_enc *)0x36f4b7);
    local_4 = -1;
  }
  else {
    local_4 = od_ec_enc_tell((od_ec_enc *)(in_RDI + 4));
    memcpy(*(void **)(in_RDI + 2),__src,(ulong)local_18);
    *in_RDI = local_18;
    od_ec_enc_clear((od_ec_enc *)0x36f505);
  }
  return local_4;
}

Assistant:

int aom_stop_encode(aom_writer *w) {
  int nb_bits;
  uint32_t bytes;
  unsigned char *data;
  data = od_ec_enc_done(&w->ec, &bytes);
  if (!data) {
    od_ec_enc_clear(&w->ec);
    return -1;
  }
  nb_bits = od_ec_enc_tell(&w->ec);
  memcpy(w->buffer, data, bytes);
  w->pos = bytes;
  od_ec_enc_clear(&w->ec);
  return nb_bits;
}